

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

int CompareMeshPoint(void *a,void *b,void *ptr)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  double dVar8;
  float fVar9;
  
  lVar2 = *(long *)((long)ptr + 8);
  lVar5 = (long)((int)b - *ptr);
  lVar6 = (long)((int)a - *ptr);
  fVar7 = *(float *)(lVar2 + lVar5 * 0xc) - *(float *)(lVar2 + lVar6 * 0xc);
  if ((fVar7 == 0.0) && (!NAN(fVar7))) {
    lVar1 = lVar2 + lVar5 * 0xc;
    lVar2 = lVar2 + lVar6 * 0xc;
    fVar7 = *(float *)(lVar1 + 4) - *(float *)(lVar2 + 4);
    if ((fVar7 == 0.0) && (!NAN(fVar7))) {
      fVar9 = *(float *)(lVar1 + 8) - *(float *)(lVar2 + 8);
      if (((fVar9 == 0.0) && (!NAN(fVar9))) && (lVar2 = *(long *)((long)ptr + 0x18), lVar2 != 0)) {
        fVar9 = *(float *)(lVar2 + lVar5 * 0xc) - *(float *)(lVar2 + lVar6 * 0xc);
        if ((fVar9 == 0.0) && (!NAN(fVar9))) {
          lVar1 = lVar2 + lVar5 * 0xc;
          lVar2 = lVar2 + lVar6 * 0xc;
          fVar9 = *(float *)(lVar1 + 4) - *(float *)(lVar2 + 4);
          if ((fVar9 == 0.0) && (!NAN(fVar9))) {
            fVar9 = *(float *)(lVar1 + 8) - *(float *)(lVar2 + 8);
          }
        }
      }
      if (((fVar9 == 0.0) && (!NAN(fVar9))) && (lVar2 = *(long *)((long)ptr + 0x10), lVar2 != 0)) {
        fVar9 = *(float *)(lVar2 + lVar5 * 8) - *(float *)(lVar2 + lVar6 * 8);
        if ((fVar9 == 0.0) && (!NAN(fVar9))) {
          fVar9 = *(float *)(lVar2 + 4 + lVar5 * 8) - *(float *)(lVar2 + 4 + lVar6 * 8);
        }
      }
      fVar7 = fVar9;
      if ((fVar9 == 0.0) && (!NAN(fVar9))) {
        if (*(long *)((long)ptr + 0x28) != 0) {
          uVar3 = ON_Color::operator_cast_to_unsigned_int
                            ((ON_Color *)(*(long *)((long)ptr + 0x28) + lVar5 * 4));
          uVar4 = ON_Color::operator_cast_to_unsigned_int
                            ((ON_Color *)(lVar6 * 4 + *(long *)((long)ptr + 0x28)));
          if ((int)uVar3 < (int)uVar4) {
            fVar7 = -1.0;
            goto LAB_0050433b;
          }
          if (uVar3 != uVar4) {
            fVar7 = 1.0;
            goto LAB_0050433b;
          }
        }
        lVar2 = *(long *)((long)ptr + 0x20);
        if (lVar2 != 0) {
          dVar8 = *(double *)(lVar2 + lVar5 * 0x10) - *(double *)(lVar2 + lVar6 * 0x10);
          fVar7 = -1.0;
          if ((0.0 <= dVar8) &&
             ((0.0 < dVar8 ||
              ((dVar8 = *(double *)(lVar5 * 0x10 + lVar2 + 8) -
                        *(double *)(lVar6 * 0x10 + lVar2 + 8), 0.0 <= dVar8 &&
               (fVar7 = fVar9, 0.0 < dVar8)))))) {
            fVar7 = 1.0;
          }
        }
      }
    }
  }
LAB_0050433b:
  uVar3 = 0xffffffff;
  if (0.0 <= fVar7) {
    uVar3 = (uint)(0.0 < fVar7);
  }
  return uVar3;
}

Assistant:

static int CompareMeshPoint(const void* a,const void* b,void* ptr)
{
  float d;
  const struct tagMESHPOINTS * mp = (const struct tagMESHPOINTS *)ptr;

  // use bogus pointer to convert a,b into vertex indices
  int i = (int)(((const char*)a) - mp->p0); // the (int) is for 64 bit size_t conversion
  int j = (int)(((const char*)b) - mp->p0);

  d = mp->V[j].x - mp->V[i].x;
  if ( d == 0.0f )
  {
    d = mp->V[j].y - mp->V[i].y;
    if ( d == 0.0f )
    {
      d = mp->V[j].z - mp->V[i].z;

      //if ( d == 0.0f )
      //  return 0;

      if ( d == 0.0f && 0 != mp->N)
      {
        d = mp->N[j].x - mp->N[i].x;
        if ( d == 0.0f )
        {
          d = mp->N[j].y - mp->N[i].y;
          if ( d == 0.0f )
          {
            d = mp->N[j].z - mp->N[i].z;
          }
        }
      }

      if ( d == 0.0f && 0 != mp->T)
      {
        d = mp->T[j].x - mp->T[i].x;
        if ( d == 0.0f )
        {
          d = mp->T[j].y - mp->T[i].y;
        }
      }

      if ( d == 0.0f && 0 != mp->C )
      {
        int u = ((int)mp->C[j])-((int)mp->C[i]);
        if ( u < 0 )
          d = -1.0f;
        else if ( u > 0 )
          d = 1.0f;
      }

      if ( d == 0.0f && 0 != mp->K )
      {
        double dk = mp->K[j].k1 - mp->K[i].k1;
        if ( dk < 0.0 )
          d = -1.0;
        else if ( dk > 0.0 )
          d = 1.0;
        else
        {
          dk = mp->K[j].k2 - mp->K[i].k2;
          if ( dk < 0.0 )
            d = -1.0;
          else if ( dk > 0.0 )
            d = 1.0;
        }
      }
    }
  }
  
  if ( d < 0.0f )
    return -1;
  if ( d > 0.0f )
    return 1;
  return 0;
}